

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O0

int ly_in_fd(ly_in *in,int fd)

{
  LY_ERR LVar1;
  char *local_30;
  char *addr;
  size_t length;
  int prev_fd;
  int fd_local;
  ly_in *in_local;
  
  length._4_4_ = fd;
  _prev_fd = in;
  if (in == (ly_in *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in","ly_in_fd");
    in_local._4_4_ = -1;
  }
  else if (in->type == LY_IN_FD) {
    length._0_4_ = (in->method).fd;
    if (fd != -1) {
      LVar1 = ly_mmap((ly_ctx *)0x0,fd,(size_t *)&addr,&local_30);
      if (LVar1 != LY_SUCCESS) {
        return -1;
      }
      if (local_30 == (char *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Empty input file.");
        return -1;
      }
      ly_munmap(_prev_fd->start,_prev_fd->length);
      (_prev_fd->method).fd = length._4_4_;
      _prev_fd->start = local_30;
      _prev_fd->current = local_30;
      _prev_fd->line = 1;
      _prev_fd->length = (size_t)addr;
    }
    in_local._4_4_ = (int)length;
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in->type == LY_IN_FD",
           "ly_in_fd");
    in_local._4_4_ = -1;
  }
  return in_local._4_4_;
}

Assistant:

LIBYANG_API_DEF int
ly_in_fd(struct ly_in *in, int fd)
{
    int prev_fd;
    size_t length;
    const char *addr;

    LY_CHECK_ARG_RET(NULL, in, in->type == LY_IN_FD, -1);

    prev_fd = in->method.fd;

    if (fd != -1) {
        LY_CHECK_RET(ly_mmap(NULL, fd, &length, (void **)&addr), -1);
        if (!addr) {
            LOGERR(NULL, LY_EINVAL, "Empty input file.");
            return -1;
        }

        ly_munmap((char *)in->start, in->length);

        in->method.fd = fd;
        in->current = in->start = addr;
        in->line = 1;
        in->length = length;
    }

    return prev_fd;
}